

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O2

Vec_Vec_t * Saig_ManCexMinCollectFrameTerms(Aig_Man_t *pAig,Abc_Cex_t *pCex)

{
  int iVar1;
  int i;
  Vec_Int_t *p;
  Vec_Vec_t *p_00;
  Aig_Obj_t *pObj;
  Vec_Int_t *pVVar2;
  int i_00;
  int i_01;
  
  p = Vec_IntAlloc((int)pAig);
  p_00 = Vec_VecStart(pCex->iFrame + 1);
  for (i_01 = pCex->iFrame; -1 < i_01; i_01 = i_01 + -1) {
    if (i_01 == pCex->iFrame) {
      pVVar2 = (Vec_Int_t *)0x0;
    }
    else {
      pVVar2 = Vec_VecEntryInt(p_00,i_01 + 1);
    }
    Saig_ManCexMinGetCos(pAig,pCex,pVVar2,p);
    Aig_ManIncrementTravId(pAig);
    iVar1 = p->nSize;
    for (i_00 = 0; i_00 < iVar1; i_00 = i_00 + 1) {
      i = Vec_IntEntry(p,i_00);
      pObj = Aig_ManObj(pAig,i);
      pVVar2 = Vec_VecEntryInt(p_00,i_01);
      Saig_ManCexMinCollectFrameTerms_rec(pAig,pObj,pVVar2);
    }
  }
  Vec_IntFree(p);
  return p_00;
}

Assistant:

Vec_Vec_t * Saig_ManCexMinCollectFrameTerms( Aig_Man_t * pAig, Abc_Cex_t * pCex )
{
    Vec_Vec_t * vFrameCis;
    Vec_Int_t * vRoots, * vLeaves;
    Aig_Obj_t * pObj;
    int i, f;
    // create terminals
    vRoots = Vec_IntAlloc( 1000 );
    vFrameCis = Vec_VecStart( pCex->iFrame+1 );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        // create roots
        vLeaves = (f == pCex->iFrame) ? NULL : Vec_VecEntryInt(vFrameCis, f+1);
        Saig_ManCexMinGetCos( pAig, pCex, vLeaves, vRoots );
        // collect nodes starting from the roots
        Aig_ManIncrementTravId( pAig );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
            Saig_ManCexMinCollectFrameTerms_rec( pAig, pObj, Vec_VecEntryInt(vFrameCis, f) );
    }
    Vec_IntFree( vRoots );
    return vFrameCis;
}